

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O0

bool __thiscall
SQCompilation::CodegenVisitor::IsLocalConstant(CodegenVisitor *this,SQObject *name,SQObject *e)

{
  size_type sVar1;
  SQObjectPtr *key;
  undefined8 *in_RDX;
  SQObject *in_RSI;
  SQTable *in_RDI;
  SQObjectPtr *tbl;
  SQInteger i;
  SQObjectPtr val;
  SQTable *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  char cVar2;
  SQObjectPtr local_60;
  SQObjectPtr *local_50;
  ulong local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 *local_20;
  SQObject *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff70);
  sVar1 = sqvector<SQObjectPtr,_unsigned_int>::size
                    ((sqvector<SQObjectPtr,_unsigned_int> *)&(in_RDI->super_SQDelegable)._delegate);
  local_38 = (ulong)sVar1;
  do {
    local_38 = local_38 - 1;
    if ((long)local_38 < 0) {
      local_1 = 0;
      goto LAB_001c19a1;
    }
    key = sqvector<SQObjectPtr,_unsigned_int>::operator[]
                    ((sqvector<SQObjectPtr,_unsigned_int> *)&(in_RDI->super_SQDelegable)._delegate,
                     (size_type)local_38);
    cVar2 = false;
    local_50 = key;
    if ((key->super_SQObject)._type != OT_NULL) {
      in_stack_ffffffffffffff70 = (key->super_SQObject)._unVal.pTable;
      ::SQObjectPtr::SQObjectPtr(&local_60,local_18);
      cVar2 = SQTable::Get(in_RDI,key,(SQObjectPtr *)CONCAT17(cVar2,in_stack_ffffffffffffff78));
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff70);
    }
  } while ((bool)cVar2 == false);
  *local_20 = local_30;
  local_20[1] = local_28;
  if (((local_50->super_SQObject)._flags & 1) != 0) {
    *(byte *)((long)local_20 + 4) = *(byte *)((long)local_20 + 4) | 1;
  }
  local_1 = 1;
LAB_001c19a1:
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff70);
  return (bool)(local_1 & 1);
}

Assistant:

bool CodegenVisitor::IsLocalConstant(const SQObject &name, SQObject &e)
{
    SQObjectPtr val;
    for (SQInteger i = SQInteger(_scopedconsts.size()) - 1; i >= 0; --i) {
        SQObjectPtr &tbl = _scopedconsts[i];
        if (!sq_isnull(tbl) && _table(tbl)->Get(name, val)) {
            e = val;
            if (tbl._flags & SQOBJ_FLAG_IMMUTABLE)
                e._flags |= SQOBJ_FLAG_IMMUTABLE;
            return true;
        }
    }
    return false;
}